

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void __thiscall kratos::Var::unassign(Var *this,shared_ptr<kratos::AssignStmt> *stmt)

{
  int iVar1;
  undefined4 extraout_var;
  shared_ptr<kratos::Stmt> local_28;
  
  std::
  _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_erase(&(((stmt->super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               right_->sinks_)._M_h);
  std::
  _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_erase(&(this->sources_)._M_h,stmt);
  iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])(this);
  local_28.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((stmt->super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        super_Stmt;
  local_28.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (stmt->super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_28.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  Generator::remove_stmt((Generator *)CONCAT44(extraout_var,iVar1),&local_28);
  if (local_28.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void Var::unassign(const std::shared_ptr<AssignStmt> &stmt) {
    // we need to take care of the slices
    stmt->right()->sinks_.erase(stmt);
    sources_.erase(stmt);
    // erase from parent if any
    // TODO: fix this will proper parent
    generator()->remove_stmt(stmt);
}